

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O1

void dynet::TensorTools::copy_elements(Tensor *v,Tensor *v_src)

{
  runtime_error *this;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  if (v->device->type == CPU) {
    if (v_src->device->type == CPU) {
      uVar1 = (ulong)(v->d).nd;
      iVar2 = 1;
      if (uVar1 != 0) {
        uVar3 = 0;
        do {
          iVar2 = iVar2 * (v->d).d[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      memcpy(v->v,v_src->v,(ulong)(iVar2 * (v->d).bd) << 2);
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Bad device type");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Bad device type");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TensorTools::copy_elements(Tensor& v, const Tensor& v_src) {
  if (v.device->type == DeviceType::CPU) {
    if (v_src.device->type == DeviceType::CPU) {
      memcpy(v.v, v_src.v, sizeof(real) * v.d.size());
#if HAVE_CUDA
    } else if (v_src.device->type == DeviceType::GPU) {
      cudaMemcpyAsync(v.v, v_src.v, sizeof(real) * v.d.size(), cudaMemcpyDeviceToHost);
#endif
    } else { throw std::runtime_error("Bad device type"); }
#if HAVE_CUDA
  } else if (v.device->type == DeviceType::GPU) {
    if (v_src.device->type == DeviceType::CPU) {
      cudaMemcpyAsync(v.v, v_src.v, sizeof(real) * v.d.size(), cudaMemcpyHostToDevice);
    } else {
      cudaMemcpyAsync(v.v, v_src.v, sizeof(real) * v.d.size(), cudaMemcpyDeviceToDevice);
    }
#endif
  } else { throw std::runtime_error("Bad device type"); }
}